

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O0

DWORD MAPMmapProtToAccessFlags(int prot)

{
  DWORD local_10;
  DWORD flAccess;
  int prot_local;
  
  local_10 = 0;
  if (prot == 0) {
    local_10 = 0;
  }
  else if ((prot & 3U) == 3) {
    local_10 = 6;
  }
  else if ((prot & 2U) == 2) {
    local_10 = 2;
  }
  else if ((prot & 1U) == 1) {
    local_10 = 4;
  }
  else {
    fprintf(_stderr,"] %s %s:%d","MAPMmapProtToAccessFlags",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/map.cpp"
            ,0x6ec);
    fprintf(_stderr,"Unknown Unix protection flag\n");
  }
  return local_10;
}

Assistant:

static DWORD MAPMmapProtToAccessFlags( int prot )
{
    DWORD flAccess = 0; // default: no access

    if (PROT_NONE == prot)
    {
        flAccess = 0;
    }
    else if ( ((PROT_READ | PROT_WRITE) & prot) == (PROT_READ | PROT_WRITE) )
    {
        flAccess = FILE_MAP_ALL_ACCESS;
    }
    else if ( (PROT_WRITE & prot) == PROT_WRITE )
    {
        flAccess = FILE_MAP_WRITE;
    }
    else if ( (PROT_READ & prot) == PROT_READ )
    {
        flAccess = FILE_MAP_READ;
    }
    else
    {
        ASSERT( "Unknown Unix protection flag\n" );
    }

    return flAccess;
}